

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::HardSigmoid_x86_avx2::forward_inplace
          (HardSigmoid_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 (*pauVar12) [32];
  long in_RSI;
  long *in_RDI;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m256 _ans_2;
  __m256 _p_2;
  __m256 _one_2;
  __m256 _zero_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _ans_1;
  __m128 _p_1;
  int i_1;
  __m128 _one_1;
  __m128 _zero_1;
  float *ptr_1;
  int q_1;
  __m256 _ans;
  __m256 _p;
  int i;
  __m256 _one;
  __m256 _zero;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_fffffffffffff648;
  Mat *this_00;
  Mat *in_stack_fffffffffffff650;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  int local_8ec;
  Mat local_8e8;
  undefined1 (*local_8a0) [32];
  int local_894;
  undefined1 local_890 [8];
  undefined8 uStack_888;
  void *local_880;
  int *piStack_878;
  int local_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  Mat local_838;
  Mat *local_7f0;
  int local_7e4;
  undefined1 local_7e0 [32];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  int local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  Mat local_718;
  undefined1 (*local_6d0) [32];
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  uint local_690;
  uint local_68c;
  undefined4 local_688;
  undefined4 local_684;
  uint local_680;
  uint local_67c;
  undefined4 local_678;
  undefined4 local_674;
  undefined1 (*local_670) [32];
  undefined1 (*local_668) [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 (*local_468) [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 (*local_428) [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float local_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float local_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 local_3ac;
  Mat *local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  void *local_320;
  int *piStack_318;
  Mat *local_308;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  uint local_260;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  uint local_248;
  uint local_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  undefined1 local_140 [32];
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_6b4 = *(int *)(in_RSI + 0x2c);
  local_6b8 = *(int *)(in_RSI + 0x30);
  local_6bc = *(int *)(in_RSI + 0x38);
  local_6c0 = local_6b4 * local_6b8;
  local_6c4 = *(int *)(in_RSI + 0x18);
  if (local_6c4 == 8) {
    local_6c4 = 8;
    for (local_6c8 = 0; local_6c8 < local_6bc; local_6c8 = local_6c8 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff650,(int)((ulong)in_stack_fffffffffffff648 >> 0x20));
      pauVar12 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_718);
      ncnn::Mat::~Mat((Mat *)0x8e2041);
      local_674 = 0;
      local_2c4 = 0;
      local_2c8 = 0;
      local_2cc = 0;
      local_2d0 = 0;
      local_2d4 = 0;
      local_2d8 = 0;
      local_2dc = 0;
      local_2e0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      local_300 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auStack_2f0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      local_760 = local_300._0_8_;
      uStack_758 = local_300._8_8_;
      uStack_750 = auStack_2f0._0_8_;
      uStack_748 = auStack_2f0._8_8_;
      local_678 = 0x3f800000;
      local_284 = 0x3f800000;
      local_288 = 0x3f800000;
      local_28c = 0x3f800000;
      local_290 = 0x3f800000;
      local_294 = 0x3f800000;
      local_298 = 0x3f800000;
      local_29c = 0x3f800000;
      local_2a0 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar13._16_16_ = auVar1;
      auVar13._0_16_ = auVar2;
      local_2c0._0_8_ = auVar2._0_8_;
      local_2c0._8_8_ = auVar2._8_8_;
      local_2c0._16_8_ = auVar1._0_8_;
      local_2c0._24_8_ = auVar1._8_8_;
      local_780 = local_2c0._0_8_;
      uStack_778 = local_2c0._8_8_;
      uStack_770 = local_2c0._16_8_;
      uStack_768 = local_2c0._24_8_;
      local_6d0 = pauVar12;
      for (local_784 = 0; local_784 < local_6c0; local_784 = local_784 + 1) {
        local_668 = local_6d0;
        local_7c0 = *(undefined8 *)*local_6d0;
        uStack_7b8 = *(undefined8 *)(*local_6d0 + 8);
        uStack_7b0 = *(undefined8 *)(*local_6d0 + 0x10);
        uStack_7a8 = *(undefined8 *)(*local_6d0 + 0x18);
        local_67c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar1 = vinsertps_avx(ZEXT416(local_67c),ZEXT416(local_67c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_67c),0x20);
        local_280 = vinsertps_avx(auVar1,ZEXT416(local_67c),0x30);
        auVar1 = vinsertps_avx(ZEXT416(local_67c),ZEXT416(local_67c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_67c),0x20);
        auStack_270 = vinsertps_avx(auVar1,ZEXT416(local_67c),0x30);
        local_680 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar1 = vinsertps_avx(ZEXT416(local_680),ZEXT416(local_680),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_680),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_680),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_680),ZEXT416(local_680),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_680),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_680),0x30);
        auVar14._16_16_ = auVar1;
        auVar14._0_16_ = auVar3;
        local_240._0_8_ = auVar3._0_8_;
        local_5e0 = local_240._0_8_;
        local_240._8_8_ = auVar3._8_8_;
        uStack_5d8 = local_240._8_8_;
        local_240._16_8_ = auVar1._0_8_;
        uStack_5d0 = local_240._16_8_;
        local_240._24_8_ = auVar1._8_8_;
        uStack_5c8 = local_240._24_8_;
        local_600 = local_280._0_8_;
        uStack_5f8 = local_280._8_8_;
        uStack_5f0 = auStack_270._0_8_;
        uStack_5e8 = auStack_270._8_8_;
        local_e0 = local_240._0_8_;
        uStack_d8 = local_240._8_8_;
        uStack_d0 = local_240._16_8_;
        uStack_c8 = local_240._24_8_;
        local_100 = local_280._0_8_;
        uStack_f8 = local_280._8_8_;
        uStack_f0 = auStack_270._0_8_;
        uStack_e8 = auStack_270._8_8_;
        auVar9._16_8_ = local_240._16_8_;
        auVar9._0_16_ = auVar3;
        auVar9._24_8_ = local_240._24_8_;
        auVar8._16_8_ = auStack_270._0_8_;
        auVar8._0_16_ = local_280;
        auVar8._24_8_ = auStack_270._8_8_;
        auVar1 = vfmadd213ps_fma(auVar9,*local_6d0,auVar8);
        local_7e0._0_8_ = auVar1._0_8_;
        local_540 = local_7e0._0_8_;
        local_7e0._8_8_ = auVar1._8_8_;
        uStack_538 = local_7e0._8_8_;
        uStack_530 = 0;
        uStack_528 = 0;
        local_560 = local_300._0_8_;
        uStack_558 = local_300._8_8_;
        uStack_550 = auStack_2f0._0_8_;
        uStack_548 = auStack_2f0._8_8_;
        auVar5._16_8_ = auStack_2f0._0_8_;
        auVar5._0_16_ = local_300;
        auVar5._24_8_ = auStack_2f0._8_8_;
        auVar15 = vmaxps_avx(ZEXT1632(auVar1),auVar5);
        local_7e0._0_8_ = auVar15._0_8_;
        local_4c0 = local_7e0._0_8_;
        local_7e0._8_8_ = auVar15._8_8_;
        uStack_4b8 = local_7e0._8_8_;
        local_7e0._16_8_ = auVar15._16_8_;
        uStack_4b0 = local_7e0._16_8_;
        local_7e0._24_8_ = auVar15._24_8_;
        uStack_4a8 = local_7e0._24_8_;
        local_4e0 = local_2c0._0_8_;
        uStack_4d8 = local_2c0._8_8_;
        uStack_4d0 = local_2c0._16_8_;
        uStack_4c8 = local_2c0._24_8_;
        auVar7._16_8_ = local_2c0._16_8_;
        auVar7._0_16_ = auVar2;
        auVar7._24_8_ = local_2c0._24_8_;
        local_7e0 = vminps_avx(auVar15,auVar7);
        local_428 = local_6d0;
        local_460 = local_7e0._0_8_;
        uStack_458 = local_7e0._8_8_;
        uStack_450 = local_7e0._16_8_;
        uStack_448 = local_7e0._24_8_;
        *(undefined8 *)*local_6d0 = local_7e0._0_8_;
        *(undefined8 *)(*local_6d0 + 8) = local_7e0._8_8_;
        *(undefined8 *)(*local_6d0 + 0x10) = local_7e0._16_8_;
        *(undefined8 *)(*local_6d0 + 0x18) = local_7e0._24_8_;
        local_6d0 = local_6d0 + 1;
        local_5c0 = local_7c0;
        uStack_5b8 = uStack_7b8;
        uStack_5b0 = uStack_7b0;
        uStack_5a8 = uStack_7a8;
        local_260 = local_67c;
        local_25c = local_67c;
        local_258 = local_67c;
        local_254 = local_67c;
        local_250 = local_67c;
        local_24c = local_67c;
        local_248 = local_67c;
        local_244 = local_67c;
        local_240 = auVar14;
        local_220 = local_680;
        local_21c = local_680;
        local_218 = local_680;
        local_214 = local_680;
        local_210 = local_680;
        local_20c = local_680;
        local_208 = local_680;
        local_204 = local_680;
        local_c0 = local_7c0;
        uStack_b8 = uStack_7b8;
        uStack_b0 = uStack_7b0;
        uStack_a8 = uStack_7a8;
      }
      local_2c0 = auVar13;
    }
  }
  else if (local_6c4 == 4) {
    local_6c4 = 4;
    for (local_7e4 = 0; local_7e4 < local_6bc; local_7e4 = local_7e4 + 1) {
      this_00 = &local_838;
      ncnn::Mat::channel(in_stack_fffffffffffff650,(int)((ulong)this_00 >> 0x20));
      in_stack_fffffffffffff650 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x8e26a1);
      local_3ac = 0;
      local_3c0 = 0;
      uStack_3bc = 0;
      uStack_3b8 = 0;
      uStack_3b4 = 0;
      local_850 = 0;
      uStack_848 = 0;
      local_3c4 = 0x3f800000;
      local_3e0 = 0x3f800000;
      uStack_3dc = 0x3f800000;
      uStack_3d8 = 0x3f800000;
      uStack_3d4 = 0x3f800000;
      local_860 = 0x3f8000003f800000;
      uStack_858 = 0x3f8000003f800000;
      local_7f0 = in_stack_fffffffffffff650;
      for (local_864 = 0; local_864 < local_6c0; local_864 = local_864 + 1) {
        local_3a8 = local_7f0;
        local_880 = local_7f0->data;
        piStack_878 = local_7f0->refcount;
        local_400 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_3a0 = CONCAT44(local_400,local_400);
        uStack_398 = CONCAT44(local_400,local_400);
        local_420 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_380 = CONCAT44(local_420,local_420);
        uStack_378 = CONCAT44(local_420,local_420);
        local_370._0_4_ = SUB84(local_880,0);
        local_370._4_4_ = (float)((ulong)local_880 >> 0x20);
        uStack_368._0_4_ = SUB84(piStack_878,0);
        uStack_368._4_4_ = (float)((ulong)piStack_878 >> 0x20);
        local_390 = (float)local_370 * local_420;
        fStack_38c = local_370._4_4_ * local_420;
        fStack_388 = (float)uStack_368 * local_420;
        fStack_384 = uStack_368._4_4_ * local_420;
        local_890._4_4_ = fStack_38c + local_400;
        local_890._0_4_ = local_390 + local_400;
        uStack_888._0_4_ = fStack_388 + local_400;
        uStack_888._4_4_ = fStack_384 + local_400;
        local_350 = local_890;
        uStack_348 = uStack_888;
        auVar1._8_8_ = uStack_888;
        auVar1._0_8_ = local_890;
        auVar1 = vmaxps_avx(auVar1,ZEXT816(0));
        local_890 = auVar1._0_8_;
        local_330 = local_890;
        uStack_888 = auVar1._8_8_;
        uStack_328 = uStack_888;
        auVar2._8_8_ = 0x3f8000003f800000;
        auVar2._0_8_ = 0x3f8000003f800000;
        _local_890 = vminps_avx(auVar1,auVar2);
        local_308 = local_7f0;
        local_320 = (void *)local_890;
        piStack_318 = uStack_888;
        local_7f0->data = (void *)local_890;
        local_7f0->refcount = uStack_888;
        local_7f0 = (Mat *)&local_7f0->elemsize;
        fStack_41c = local_420;
        fStack_418 = local_420;
        fStack_414 = local_420;
        local_404 = local_420;
        fStack_3fc = local_400;
        fStack_3f8 = local_400;
        fStack_3f4 = local_400;
        local_3e4 = local_400;
        local_370 = local_880;
        uStack_368 = piStack_878;
        local_360 = local_850;
        uStack_358 = uStack_848;
        local_340 = local_860;
        uStack_338 = uStack_858;
      }
    }
  }
  else {
    for (local_894 = 0; local_894 < local_6bc; local_894 = local_894 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff650,(int)((ulong)in_stack_fffffffffffff648 >> 0x20));
      pauVar12 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_8e8);
      ncnn::Mat::~Mat((Mat *)0x8e29c3);
      local_8ec = 0;
      local_684 = 0;
      local_1c4 = 0;
      local_1c8 = 0;
      local_1cc = 0;
      local_1d0 = 0;
      local_1d4 = 0;
      local_1d8 = 0;
      local_1dc = 0;
      local_1e0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      local_200 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auStack_1f0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      local_688 = 0x3f800000;
      local_184 = 0x3f800000;
      local_188 = 0x3f800000;
      local_18c = 0x3f800000;
      local_190 = 0x3f800000;
      local_194 = 0x3f800000;
      local_198 = 0x3f800000;
      local_19c = 0x3f800000;
      local_1a0 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar15._16_16_ = auVar1;
      auVar15._0_16_ = auVar2;
      local_1c0._0_8_ = auVar2._0_8_;
      local_1c0._8_8_ = auVar2._8_8_;
      local_1c0._16_8_ = auVar1._0_8_;
      local_1c0._24_8_ = auVar1._8_8_;
      local_8a0 = pauVar12;
      for (; local_8ec + 7 < local_6c0; local_8ec = local_8ec + 8) {
        local_670 = local_8a0;
        local_620 = *(undefined8 *)*local_8a0;
        uStack_618 = *(undefined8 *)(*local_8a0 + 8);
        uStack_610 = *(undefined8 *)(*local_8a0 + 0x10);
        uStack_608 = *(undefined8 *)(*local_8a0 + 0x18);
        local_68c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar1 = vinsertps_avx(ZEXT416(local_68c),ZEXT416(local_68c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_68c),0x20);
        local_180 = vinsertps_avx(auVar1,ZEXT416(local_68c),0x30);
        auVar1 = vinsertps_avx(ZEXT416(local_68c),ZEXT416(local_68c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_68c),0x20);
        auStack_170 = vinsertps_avx(auVar1,ZEXT416(local_68c),0x30);
        local_690 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar1 = vinsertps_avx(ZEXT416(local_690),ZEXT416(local_690),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_690),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_690),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_690),ZEXT416(local_690),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_690),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_690),0x30);
        auVar16._16_16_ = auVar1;
        auVar16._0_16_ = auVar3;
        local_140._0_8_ = auVar3._0_8_;
        local_640 = local_140._0_8_;
        local_140._8_8_ = auVar3._8_8_;
        uStack_638 = local_140._8_8_;
        local_140._16_8_ = auVar1._0_8_;
        uStack_630 = local_140._16_8_;
        local_140._24_8_ = auVar1._8_8_;
        uStack_628 = local_140._24_8_;
        local_660 = local_180._0_8_;
        uStack_658 = local_180._8_8_;
        uStack_650 = auStack_170._0_8_;
        uStack_648 = auStack_170._8_8_;
        local_80 = local_140._0_8_;
        uStack_78 = local_140._8_8_;
        uStack_70 = local_140._16_8_;
        uStack_68 = local_140._24_8_;
        local_a0 = local_180._0_8_;
        uStack_98 = local_180._8_8_;
        uStack_90 = auStack_170._0_8_;
        uStack_88 = auStack_170._8_8_;
        auVar11._16_8_ = local_140._16_8_;
        auVar11._0_16_ = auVar3;
        auVar11._24_8_ = local_140._24_8_;
        auVar10._16_8_ = auStack_170._0_8_;
        auVar10._0_16_ = local_180;
        auVar10._24_8_ = auStack_170._8_8_;
        auVar1 = vfmadd213ps_fma(auVar11,*local_8a0,auVar10);
        local_980 = auVar1._0_8_;
        local_580 = local_980;
        uStack_978 = auVar1._8_8_;
        uStack_578 = uStack_978;
        uStack_570 = 0;
        uStack_568 = 0;
        local_5a0 = local_200._0_8_;
        uStack_598 = local_200._8_8_;
        uStack_590 = auStack_1f0._0_8_;
        uStack_588 = auStack_1f0._8_8_;
        auVar4._16_8_ = auStack_1f0._0_8_;
        auVar4._0_16_ = local_200;
        auVar4._24_8_ = auStack_1f0._8_8_;
        auVar4 = vmaxps_avx(ZEXT1632(auVar1),auVar4);
        local_980 = auVar4._0_8_;
        local_500 = local_980;
        uStack_978 = auVar4._8_8_;
        uStack_4f8 = uStack_978;
        uStack_970 = auVar4._16_8_;
        uStack_4f0 = uStack_970;
        uStack_968 = auVar4._24_8_;
        uStack_4e8 = uStack_968;
        local_520 = local_1c0._0_8_;
        uStack_518 = local_1c0._8_8_;
        uStack_510 = local_1c0._16_8_;
        uStack_508 = local_1c0._24_8_;
        auVar6._16_8_ = local_1c0._16_8_;
        auVar6._0_16_ = auVar2;
        auVar6._24_8_ = local_1c0._24_8_;
        auVar4 = vminps_avx(auVar4,auVar6);
        local_468 = local_8a0;
        local_980 = auVar4._0_8_;
        local_4a0 = local_980;
        uStack_978 = auVar4._8_8_;
        uStack_498 = uStack_978;
        uStack_970 = auVar4._16_8_;
        uStack_490 = uStack_970;
        uStack_968 = auVar4._24_8_;
        uStack_488 = uStack_968;
        *(undefined8 *)*local_8a0 = local_980;
        *(undefined8 *)(*local_8a0 + 8) = uStack_978;
        *(undefined8 *)(*local_8a0 + 0x10) = uStack_970;
        *(undefined8 *)(*local_8a0 + 0x18) = uStack_968;
        local_8a0 = local_8a0 + 1;
        local_160 = local_68c;
        local_15c = local_68c;
        local_158 = local_68c;
        local_154 = local_68c;
        local_150 = local_68c;
        local_14c = local_68c;
        local_148 = local_68c;
        local_144 = local_68c;
        local_140 = auVar16;
        local_120 = local_690;
        local_11c = local_690;
        local_118 = local_690;
        local_114 = local_690;
        local_110 = local_690;
        local_10c = local_690;
        local_108 = local_690;
        local_104 = local_690;
        local_60 = local_620;
        uStack_58 = uStack_618;
        uStack_50 = uStack_610;
        uStack_48 = uStack_608;
      }
      for (; local_8ec < local_6c0; local_8ec = local_8ec + 1) {
        if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *(float *)*local_8a0) {
          if (*(float *)*local_8a0 <= *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc))
          {
            *(float *)*local_8a0 =
                 *(float *)*local_8a0 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
                 + *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          }
          else {
            *(undefined4 *)*local_8a0 = 0x3f800000;
          }
        }
        else {
          *(undefined4 *)*local_8a0 = 0;
        }
        local_8a0 = (undefined1 (*) [32])(*local_8a0 + 4);
      }
      local_1c0 = auVar15;
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ++ptr;
        }
    }

    return 0;
}